

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

uint32_t cfd::core::ConfidentialTxIn::EstimateTxInVsize
                   (AddressType addr_type,Script *redeem_script,uint32_t pegin_btc_tx_size,
                   Script *claim_script,bool is_issuance,bool is_blind,bool is_reissuance,
                   Script *scriptsig_template,int exponent,int minimum_bits,
                   uint32_t *rangeproof_size,uint32_t txoutproof_size)

{
  uint32_t uVar1;
  uint32_t no_witness_size;
  uint32_t witness_size;
  Script local_a0;
  Script local_68;
  
  witness_size = 0;
  no_witness_size = 0;
  Script::Script(&local_68,redeem_script);
  Script::Script(&local_a0,claim_script);
  EstimateTxInSize(addr_type,&local_68,pegin_btc_tx_size,&local_a0,is_issuance,is_blind,
                   &witness_size,&no_witness_size,is_reissuance,scriptsig_template,exponent,
                   minimum_bits,rangeproof_size,txoutproof_size);
  Script::~Script(&local_a0);
  Script::~Script(&local_68);
  uVar1 = AbstractTransaction::GetVsizeFromSize(no_witness_size,witness_size);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTxIn::EstimateTxInVsize(
    AddressType addr_type, Script redeem_script, uint32_t pegin_btc_tx_size,
    Script claim_script, bool is_issuance, bool is_blind, bool is_reissuance,
    const Script *scriptsig_template, int exponent, int minimum_bits,
    uint32_t *rangeproof_size, uint32_t txoutproof_size) {
  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  ConfidentialTxIn::EstimateTxInSize(
      addr_type, redeem_script, pegin_btc_tx_size, claim_script, is_issuance,
      is_blind, &witness_size, &no_witness_size, is_reissuance,
      scriptsig_template, exponent, minimum_bits, rangeproof_size,
      txoutproof_size);
  return AbstractTransaction::GetVsizeFromSize(no_witness_size, witness_size);
}